

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O0

IPipelineState * __thiscall
Diligent::ArchiverImpl::GetPipelineState(ArchiverImpl *this,PIPELINE_TYPE PSOType,char *PSOName)

{
  bool bVar1;
  ResourceType _Type;
  Char *Message;
  pointer ppVar2;
  ArchiverImpl *local_c8;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
  local_98;
  NamedResourceKey local_90;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
  local_78;
  iterator it;
  undefined1 local_68 [8];
  string msg;
  ResourceType ResType;
  lock_guard<std::mutex> Guard;
  char *PSOName_local;
  PIPELINE_TYPE PSOType_local;
  ArchiverImpl *this_local;
  
  Guard._M_device = (mutex_type *)PSOName;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd0,&this->m_PipelinesMtx);
  _Type = PiplineTypeToArchiveResourceType(PSOType);
  if (_Type == Undefined) {
    FormatString<char[25]>((string *)local_68,(char (*) [25])"Unexpected pipeline type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x1a2);
    std::__cxx11::string::~string((string *)local_68);
    this_local = (ArchiverImpl *)0x0;
  }
  else {
    DeviceObjectArchive::NamedResourceKey::NamedResourceKey
              (&local_90,_Type,(char *)Guard._M_device,false);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>_>
         ::find(&this->m_Pipelines,&local_90);
    DeviceObjectArchive::NamedResourceKey::~NamedResourceKey(&local_90);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>_>
         ::end(&this->m_Pipelines);
    bVar1 = std::__detail::operator!=(&local_78,&local_98);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>
                             *)&local_78);
      local_c8 = (ArchiverImpl *)
                 RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::RawPtr(&ppVar2->second);
    }
    else {
      local_c8 = (ArchiverImpl *)0x0;
    }
    this_local = local_c8;
  }
  it.
  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
  ._M_cur._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd0);
  return (IPipelineState *)this_local;
}

Assistant:

IPipelineState* ArchiverImpl::GetPipelineState(PIPELINE_TYPE PSOType,
                                               const char*   PSOName)
{
    std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

    const auto ResType = PiplineTypeToArchiveResourceType(PSOType);
    if (ResType == ResourceType::Undefined)
    {
        UNEXPECTED("Unexpected pipeline type");
        return nullptr;
    }

    auto it = m_Pipelines.find(NamedResourceKey{ResType, PSOName});
    return it != m_Pipelines.end() ? it->second.RawPtr() : nullptr;
}